

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::ParseUnionTest(void)

{
  bool bVar1;
  IDLOptions local_1fd0;
  undefined1 local_1cc0 [8];
  Parser parser3;
  char *source;
  undefined1 local_1228 [8];
  Parser parser2;
  IDLOptions local_a98;
  undefined1 local_788 [8];
  Parser parser;
  
  IDLOptions::IDLOptions(&local_a98);
  Parser::Parser((Parser *)local_788,&local_a98);
  IDLOptions::~IDLOptions(&local_a98);
  bVar1 = Parser::Parse((Parser *)local_788,
                        "table T { A:int; }union U { T }table V { X:U; }root_type V;{ X:{ A:1 }, X_type: T }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(\"table T { A:int; }\" \"union U { T }\" \"table V { X:U; }\" \"root_type V;\" \"{ X:{ A:1 }, X_type: T }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x345,"");
  IDLOptions::IDLOptions((IDLOptions *)&source);
  Parser::Parser((Parser *)local_1228,(IDLOptions *)&source);
  IDLOptions::~IDLOptions((IDLOptions *)&source);
  bVar1 = Parser::Parse((Parser *)local_1228,
                        "namespace N; table A {} namespace; union U { N.A }table B { e:U; } root_type B;{ e_type: N_A, e: {} }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser2.Parse(\"namespace N; table A {} namespace; union U { N.A }\" \"table B { e:U; } root_type B;\" \"{ e_type: N_A, e: {} }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x34b,"");
  parser3._1912_8_ = anon_var_dwarf_29ad6e;
  IDLOptions::IDLOptions(&local_1fd0);
  Parser::Parser((Parser *)local_1cc0,&local_1fd0);
  IDLOptions::~IDLOptions(&local_1fd0);
  parser3.opts.mini_reflect = 0x208;
  parser3.opts.require_explicit_ids = false;
  parser3.opts.rust_serialize = false;
  parser3.opts.rust_module_root_file = false;
  parser3.opts._663_1_ = 0;
  bVar1 = Parser::Parse((Parser *)local_1cc0,(char *)parser3._1912_8_,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser3.Parse(source)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x351,"");
  parser3.opts._656_8_ = ZEXT48(parser3.opts.mini_reflect & kTypes);
  bVar1 = Parser::Parse((Parser *)local_1cc0,(char *)parser3._1912_8_,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,false,"\'parser3.Parse(source)\' != \'false\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x354,"");
  Parser::~Parser((Parser *)local_1cc0);
  Parser::~Parser((Parser *)local_1228);
  Parser::~Parser((Parser *)local_788);
  return;
}

Assistant:

void ParseUnionTest() {
  // Unions must be parseable with the type field following the object.
  flatbuffers::Parser parser;
  TEST_EQ(parser.Parse("table T { A:int; }"
                       "union U { T }"
                       "table V { X:U; }"
                       "root_type V;"
                       "{ X:{ A:1 }, X_type: T }"),
          true);
  // Unions must be parsable with prefixed namespace.
  flatbuffers::Parser parser2;
  TEST_EQ(parser2.Parse("namespace N; table A {} namespace; union U { N.A }"
                        "table B { e:U; } root_type B;"
                        "{ e_type: N_A, e: {} }"),
          true);

  // Test union underlying type
  const char *source = "table A {} table B {} union U : int {A, B} table C {test_union: U; test_vector_of_union: [U];}";
  flatbuffers::Parser parser3;
  parser3.opts.lang_to_generate = flatbuffers::IDLOptions::kCpp | flatbuffers::IDLOptions::kTs;
  TEST_EQ(parser3.Parse(source), true);
  
  parser3.opts.lang_to_generate &= flatbuffers::IDLOptions::kJava;
  TEST_EQ(parser3.Parse(source), false);
}